

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

BailOutInstrTemplate<IR::Instr> *
IR::BailOutInstrTemplate<IR::Instr>::New
          (OpCode opcode,Opnd *dst,Opnd *src1,Opnd *src2,BailOutKind kind,Instr *bailOutTarget,
          Func *func)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  BailOutInstrTemplate<IR::Instr> *pBVar4;
  undefined4 *puVar5;
  
  pBVar4 = New(opcode,dst,src1,kind,bailOutTarget,func);
  if ((pBVar4->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_004be8ce;
    *puVar5 = 0;
  }
  func_00 = (pBVar4->super_Instr).m_func;
  if (src2->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_004be8ce:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar3 = src2->field_0xb;
  if ((bVar3 & 2) != 0) {
    src2 = Opnd::Copy(src2,func_00);
    bVar3 = src2->field_0xb;
  }
  src2->field_0xb = bVar3 | 2;
  (pBVar4->super_Instr).m_src2 = src2;
  return pBVar4;
}

Assistant:

BailOutInstrTemplate<InstrType> *
BailOutInstrTemplate<InstrType>::New(Js::OpCode opcode, IR::Opnd *dst, IR::Opnd *src1, IR::Opnd *src2, BailOutKind kind, IR::Instr * bailOutTarget, Func * func)
{
    BailOutInstrTemplate *instr = BailOutInstrTemplate::New(opcode, dst, src1, kind, bailOutTarget, func);
    instr->SetSrc2(src2);

    return instr;
}